

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object.c
# Opt level: O0

int object_set(object obj,char *key,value v)

{
  int iVar1;
  attribute paVar2;
  undefined8 in_RDX;
  attribute in_RSI;
  undefined8 *in_RDI;
  attribute attr;
  accessor_type accessor;
  klass in_stack_ffffffffffffffa8;
  undefined4 local_30 [2];
  attribute local_28;
  undefined8 local_20;
  attribute local_18;
  undefined8 *local_10;
  int local_4;
  
  if (((in_RDI == (undefined8 *)0x0) || (in_RDI[3] == 0)) || (*(long *)(in_RDI[3] + 0x10) == 0)) {
    local_4 = 1;
  }
  else {
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    paVar2 = class_attribute(in_stack_ffffffffffffffa8,(char *)0x127aa6);
    if (paVar2 == (attribute)0x0) {
      if (*(int *)(local_10 + 1) == 0) {
        log_write_impl_va("metacall",0x12a,"object_set",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_object.c"
                          ,LOG_LEVEL_ERROR,"Attribute %s in object %s is not defined",local_18,
                          *local_10);
        return 3;
      }
      if (*(int *)(local_10 + 1) == 1) {
        local_28 = local_18;
      }
      local_30[0] = 1;
    }
    else {
      local_30[0] = 0;
      local_28 = paVar2;
    }
    iVar1 = (**(code **)(local_10[3] + 0x10))(local_10,local_10[2],local_30,local_20);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      log_write_impl_va("metacall",0x13d,"object_set",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_object.c"
                        ,LOG_LEVEL_ERROR,"Invalid class %s set of static attribute %s",*local_10,
                        local_18);
      local_4 = 2;
    }
  }
  return local_4;
}

Assistant:

int object_set(object obj, const char *key, value v)
{
	if (obj != NULL && obj->interface != NULL && obj->interface->set != NULL)
	{
		struct accessor_type accessor;
		attribute attr = class_attribute(obj->cls, key);

		if (attr == NULL)
		{
			switch (obj->accessor)
			{
				case ACCESSOR_TYPE_STATIC: {
					log_write("metacall", LOG_LEVEL_ERROR, "Attribute %s in object %s is not defined", key, obj->name);
					return 3;
				}

				case ACCESSOR_TYPE_DYNAMIC: {
					accessor.data.key = key;
				}
			}

			accessor.id = ACCESSOR_TYPE_DYNAMIC;
		}
		else
		{
			accessor.data.attr = attr;
			accessor.id = ACCESSOR_TYPE_STATIC;
		}

		if (obj->interface->set(obj, obj->impl, &accessor, v) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid class %s set of static attribute %s", obj->name, key);
			return 2;
		}

		return 0;
	}

	return 1;
}